

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test8::initIteration(GPUShaderFP64Test8 *this,_test_case *test_case)

{
  _func_int **pp_Var1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GPUShaderFP64Test8 *pGVar4;
  GPUShaderFP64Test8 *pGVar5;
  char *cs_body_raw_ptr;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  pointer local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined8 local_40;
  pointer local_38;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  pGVar4 = (GPUShaderFP64Test8 *)local_90;
  getComputeShaderBody_abi_cxx11_((string *)pGVar4,this,test_case);
  local_60._M_p = (pointer)&test_case->cs_shader_body;
  std::__cxx11::string::operator=((string *)local_60._M_p,(string *)pGVar4);
  pp_Var1 = (_func_int **)(local_90 + 0x10);
  if ((_func_int **)local_90._0_8_ != pp_Var1) {
    pGVar4 = (GPUShaderFP64Test8 *)(local_90._16_8_ + 1);
    operator_delete((void *)local_90._0_8_,(ulong)pGVar4);
  }
  pGVar5 = (GPUShaderFP64Test8 *)local_90;
  getFragmentShaderBody_abi_cxx11_((string *)pGVar5,pGVar4,test_case);
  local_70._8_8_ = &test_case->fs_shader_body;
  std::__cxx11::string::operator=((string *)local_70._8_8_,(string *)pGVar5);
  if ((_func_int **)local_90._0_8_ != pp_Var1) {
    pGVar5 = (GPUShaderFP64Test8 *)(local_90._16_8_ + 1);
    operator_delete((void *)local_90._0_8_,(ulong)pGVar5);
  }
  pGVar4 = (GPUShaderFP64Test8 *)local_90;
  getGeometryShaderBody_abi_cxx11_((string *)pGVar4,pGVar5,test_case);
  local_70._M_allocated_capacity = (size_type)&test_case->gs_shader_body;
  std::__cxx11::string::operator=((string *)local_70._M_allocated_capacity,(string *)pGVar4);
  if ((_func_int **)local_90._0_8_ != pp_Var1) {
    pGVar4 = (GPUShaderFP64Test8 *)(local_90._16_8_ + 1);
    operator_delete((void *)local_90._0_8_,(ulong)pGVar4);
  }
  pGVar5 = (GPUShaderFP64Test8 *)local_90;
  getTessellationControlShaderBody_abi_cxx11_((string *)pGVar5,pGVar4,test_case);
  std::__cxx11::string::operator=((string *)&test_case->tc_shader_body,(string *)pGVar5);
  if ((_func_int **)local_90._0_8_ != pp_Var1) {
    pGVar5 = (GPUShaderFP64Test8 *)(local_90._16_8_ + 1);
    operator_delete((void *)local_90._0_8_,(ulong)pGVar5);
  }
  pGVar4 = (GPUShaderFP64Test8 *)local_90;
  getTessellationEvaluationShaderBody_abi_cxx11_((string *)pGVar4,pGVar5,test_case);
  std::__cxx11::string::operator=((string *)&test_case->te_shader_body,(string *)pGVar4);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    pGVar4 = (GPUShaderFP64Test8 *)(local_90._16_8_ + 1);
    operator_delete((void *)local_90._0_8_,(ulong)pGVar4);
  }
  getVertexShaderBody_abi_cxx11_((string *)local_90,pGVar4,test_case);
  std::__cxx11::string::operator=((string *)&test_case->vs_shader_body,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
  }
  local_90._0_8_ = *(undefined8 *)local_60._M_p;
  local_38 = *(pointer *)local_70._8_8_;
  local_40 = *(undefined8 *)local_70._M_allocated_capacity;
  local_50._8_8_ = (test_case->tc_shader_body)._M_dataplus._M_p;
  local_50._M_allocated_capacity = (size_type)(test_case->te_shader_body)._M_dataplus._M_p;
  local_58 = (test_case->vs_shader_body)._M_dataplus._M_p;
  if (this->m_cs_id != 0) {
    (**(code **)(lVar3 + 0x12b8))(this->m_cs_id,1,local_90,0);
  }
  (**(code **)(lVar3 + 0x12b8))(this->m_fs_id,1,&local_38,0);
  (**(code **)(lVar3 + 0x12b8))(this->m_gs_id,1,&local_40,0);
  (**(code **)(lVar3 + 0x12b8))(this->m_tc_id,1,local_50._M_local_buf + 8,0);
  (**(code **)(lVar3 + 0x12b8))(this->m_te_id,1,&local_50,0);
  (**(code **)(lVar3 + 0x12b8))(this->m_vs_id,1,&local_58,0);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2adf);
  return;
}

Assistant:

void GPUShaderFP64Test8::initIteration(_test_case& test_case)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	test_case.cs_shader_body = getComputeShaderBody(test_case);
	test_case.fs_shader_body = getFragmentShaderBody(test_case);
	test_case.gs_shader_body = getGeometryShaderBody(test_case);
	test_case.tc_shader_body = getTessellationControlShaderBody(test_case);
	test_case.te_shader_body = getTessellationEvaluationShaderBody(test_case);
	test_case.vs_shader_body = getVertexShaderBody(test_case);

	/* Assign the bodies to relevant shaders */
	const char* cs_body_raw_ptr = test_case.cs_shader_body.c_str();
	const char* fs_body_raw_ptr = test_case.fs_shader_body.c_str();
	const char* gs_body_raw_ptr = test_case.gs_shader_body.c_str();
	const char* tc_body_raw_ptr = test_case.tc_shader_body.c_str();
	const char* te_body_raw_ptr = test_case.te_shader_body.c_str();
	const char* vs_body_raw_ptr = test_case.vs_shader_body.c_str();

	/* m_cs_id is initialized only if compute_shader is supported */
	if (0 != m_cs_id)
	{
		gl.shaderSource(m_cs_id, 1 /* count */, &cs_body_raw_ptr, DE_NULL /* length */);
	}

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");
}